

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O1

ifstream_t * ifstream_new(ifstream_handler_t *handler)

{
  void *pvVar1;
  _func_void_void_ptr *p_Var2;
  _func_void_void_ptr_uint8_t_ptr_uint32_t *p_Var3;
  ifstream_t *piVar4;
  int *piVar5;
  
  piVar4 = (ifstream_t *)malloc(0x20);
  if (piVar4 == (ifstream_t *)0x0) {
    piVar5 = __errno_location();
    *piVar5 = 0xc;
  }
  else {
    pvVar1 = handler->arg;
    p_Var2 = handler->open;
    p_Var3 = handler->write;
    (piVar4->handler).close = handler->close;
    (piVar4->handler).write = p_Var3;
    (piVar4->handler).arg = pvVar1;
    (piVar4->handler).open = p_Var2;
  }
  return piVar4;
}

Assistant:

ifstream_t *ifstream_new(ifstream_handler_t *handler){
   ifstream_t *self = (ifstream_t*) malloc(sizeof(ifstream_t));
   if(self != 0){
      ifstream_create(self,handler);
   }
   else{
      errno = ENOMEM;
   }
   return self;
}